

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve_network_color_quantity.cpp
# Opt level: O2

void __thiscall
polyscope::CurveNetworkNodeColorQuantity::CurveNetworkNodeColorQuantity
          (CurveNetworkNodeColorQuantity *this,string *name,
          vector<glm::vec<3,_float,_(glm::qualifier)0>,_std::allocator<glm::vec<3,_float,_(glm::qualifier)0>_>_>
          *values_,CurveNetwork *network_)

{
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,(string *)name);
  std::__cxx11::string::string((string *)&local_58,"node",&local_59);
  CurveNetworkColorQuantity::CurveNetworkColorQuantity
            (&this->super_CurveNetworkColorQuantity,&local_38,network_,&local_58,values_);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  (this->super_CurveNetworkColorQuantity).super_CurveNetworkQuantity.
  super_QuantityS<polyscope::CurveNetwork>.super_Quantity._vptr_Quantity =
       (_func_int **)&PTR__CurveNetworkColorQuantity_00597fc0;
  return;
}

Assistant:

CurveNetworkNodeColorQuantity::CurveNetworkNodeColorQuantity(std::string name, std::vector<glm::vec3> values_,
                                                             CurveNetwork& network_)
    : CurveNetworkColorQuantity(name, network_, "node", values_) {}